

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_x_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  ushort uVar21;
  long lVar22;
  undefined8 *puVar23;
  int in_ECX;
  uint uVar24;
  uint uVar25;
  int iVar26;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_16b_3;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_clip_1;
  __m256i res_16b_2;
  __m256i round_result_hi;
  __m256i round_result_lo;
  __m256i comp_avg_res_hi;
  __m256i comp_avg_res_lo;
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i data_01_1;
  __m256i data_1_1;
  __m256i data_0_1;
  __m256i res_unsigned_hi;
  __m256i res2;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_16b_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_clip;
  __m256i res_16b;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i data_01;
  __m256i data_1;
  __m256i data_0;
  __m256i res_unsigned_lo;
  __m256i res1;
  __m256i res_odd;
  __m256i res_even;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  __m256i clip_pixel_to_bd;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  __m128i round_shift_bits;
  __m128i round_shift_x;
  __m256i round_const_x;
  __m256i zero;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i coeffs_x [4];
  __m256i s [4];
  int j;
  int i;
  int bits;
  uint16_t *src_ptr;
  int fo_horiz;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined4 in_stack_ffffffffffffef98;
  undefined2 in_stack_ffffffffffffef9c;
  undefined4 uVar31;
  uint subpel_q4;
  uint uVar32;
  undefined3 in_stack_ffffffffffffefb0;
  undefined4 uVar33;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  __m256i *in_stack_fffffffffffff008;
  __m256i *in_stack_fffffffffffff010;
  int use_dist_wtd_comp_avg_00;
  __m256i *in_stack_fffffffffffff018;
  __m256i *wt0_00;
  undefined1 local_fe0 [32];
  __m256i *palStack_fc8;
  undefined8 local_e40;
  undefined8 uStack_e10;
  undefined8 local_e00;
  undefined8 uStack_dd0;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  byte local_b84;
  byte local_b44;
  int local_97c;
  int local_978;
  ulong local_930;
  ulong local_910;
  ulong uStack_8d8;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  __m256i *res_unsigned;
  __m256i *data_ref_0_00;
  
  lVar5 = *(long *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 8);
  iVar3 = *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x10);
  lVar22 = in_RDI + (long)(int)((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1) * -2;
  iVar4 = *(int *)CONCAT44(in_stack_0000001c,subpel_x_qn);
  subpel_q4 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x28);
  uVar32 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x2c);
  auVar6 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar6 = vpinsrd_avx(auVar6,subpel_q4,2);
  vpinsrd_avx(auVar6,subpel_q4,3);
  auVar6 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar6 = vpinsrd_avx(auVar6,subpel_q4,2);
  vpinsrd_avx(auVar6,subpel_q4,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar6 = vpinsrd_avx(auVar6,uVar32,2);
  vpinsrd_avx(auVar6,uVar32,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar6 = vpinsrd_avx(auVar6,uVar32,2);
  vpinsrd_avx(auVar6,uVar32,3);
  uStack_8d8 = SUB328(ZEXT832(0),4);
  uVar24 = (1 << (*(byte *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) & 0x1f)) >> 1;
  auVar6 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar6 = vpinsrd_avx(auVar6,uVar24,2);
  auVar6 = vpinsrd_avx(auVar6,uVar24,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar7 = vpinsrd_avx(auVar7,uVar24,2);
  auVar7 = vpinsrd_avx(auVar7,uVar24,3);
  uStack_130 = auVar7._0_8_;
  uStack_128 = auVar7._8_8_;
  local_910 = CONCAT44(0,*(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14));
  local_930 = CONCAT44(0,7 - *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18));
  cVar20 = ((char)conv_params -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14)) -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18);
  local_b44 = cVar20 + 0xe;
  uVar33 = CONCAT13(local_b44,in_stack_ffffffffffffefb0);
  iVar26 = 1 << (local_b44 & 0x1f);
  uVar25 = iVar26 + (1 << (cVar20 + 0xdU & 0x1f));
  auVar7 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar7 = vpinsrd_avx(auVar7,uVar25,2);
  auVar7 = vpinsrd_avx(auVar7,uVar25,3);
  auVar30 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar30 = vpinsrd_avx(auVar30,uVar25,2);
  auVar30 = vpinsrd_avx(auVar30,uVar25,3);
  uStack_f0 = auVar30._0_8_;
  uStack_e8 = auVar30._8_8_;
  local_b84 = 0xe - ((char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) +
                    (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18));
  uVar25 = (1 << (local_b84 & 0x1f)) >> 1;
  auVar30 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar30 = vpinsrd_avx(auVar30,uVar25,2);
  vpinsrd_avx(auVar30,uVar25,3);
  auVar30 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar30 = vpinsrd_avx(auVar30,uVar25,2);
  vpinsrd_avx(auVar30,uVar25,3);
  if ((int)conv_params == 10) {
    uVar31 = 0x3ff;
  }
  else {
    uVar31 = 0xff;
    if ((int)conv_params == 0xc) {
      uVar31 = 0xfff;
    }
  }
  uVar21 = (ushort)uVar31;
  auVar30 = vpinsrw_avx(ZEXT216(uVar21),uVar31,1);
  auVar30 = vpinsrw_avx(auVar30,uVar31,2);
  auVar30 = vpinsrw_avx(auVar30,uVar31,3);
  auVar30 = vpinsrw_avx(auVar30,uVar31,4);
  auVar30 = vpinsrw_avx(auVar30,uVar31,5);
  auVar30 = vpinsrw_avx(auVar30,uVar31,6);
  auVar30 = vpinsrw_avx(auVar30,uVar31,7);
  auVar27 = vpinsrw_avx(ZEXT216(uVar21),uVar31,1);
  auVar27 = vpinsrw_avx(auVar27,uVar31,2);
  auVar27 = vpinsrw_avx(auVar27,uVar31,3);
  auVar27 = vpinsrw_avx(auVar27,uVar31,4);
  auVar27 = vpinsrw_avx(auVar27,uVar31,5);
  auVar27 = vpinsrw_avx(auVar27,uVar31,6);
  auVar27 = vpinsrw_avx(auVar27,uVar31,7);
  auVar27 = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar27;
  auVar30 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
  prepare_coeffs((InterpFilterParams *)CONCAT44(uVar24,uVar32),subpel_q4,
                 (__m256i *)
                 CONCAT26(uVar21,CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)));
  for (local_97c = 0; local_97c < in_R8D; local_97c = local_97c + 8) {
    for (local_978 = 0; local_978 < in_R9D; local_978 = local_978 + 2) {
      pauVar1 = (undefined1 (*) [32])(lVar22 + (long)(local_978 * in_ESI + local_97c) * 2);
      pauVar2 = (undefined1 (*) [32])(lVar22 + (long)((local_978 + 1) * in_ESI + local_97c) * 2);
      auVar8 = vperm2i128_avx2(*pauVar1,*pauVar2,0x20);
      auVar9 = vperm2i128_avx2(*pauVar1,*pauVar2,0x31);
      vpalignr_avx2(auVar9,auVar8,4);
      vpalignr_avx2(auVar9,auVar8,8);
      auVar28 = vpalignr_avx2(auVar9,auVar8,0xc);
      convolve(in_stack_fffffffffffff010,in_stack_fffffffffffff008);
      auVar29._16_8_ = uStack_130;
      auVar29._0_16_ = auVar6;
      auVar29._24_8_ = uStack_128;
      auVar28 = vpaddd_avx2(auVar28,auVar29);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_910;
      auVar29 = vpsrad_avx2(auVar28,auVar17);
      vpalignr_avx2(auVar9,auVar8,2);
      vpalignr_avx2(auVar9,auVar8,6);
      vpalignr_avx2(auVar9,auVar8,10);
      auVar28 = vpalignr_avx2(auVar9,auVar8,0xe);
      convolve(in_stack_fffffffffffff010,in_stack_fffffffffffff008);
      auVar8._16_8_ = uStack_130;
      auVar8._0_16_ = auVar6;
      auVar8._24_8_ = uStack_128;
      auVar28 = vpaddd_avx2(auVar28,auVar8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_910;
      auVar28 = vpsrad_avx2(auVar28,auVar16);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_930;
      auVar29 = vpslld_avx2(auVar29,auVar19);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_930;
      auVar8 = vpslld_avx2(auVar28,auVar18);
      auVar28 = vpunpckldq_avx2(auVar29,auVar8);
      auVar9._16_8_ = uStack_f0;
      auVar9._0_16_ = auVar7;
      auVar9._24_8_ = uStack_e8;
      auVar28 = vpaddd_avx2(auVar28,auVar9);
      use_dist_wtd_comp_avg_00 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
      uStack_bd0 = auVar30._0_8_;
      uStack_bc8 = auVar30._8_8_;
      if (in_R8D - local_97c < 8) {
        if (iVar4 == 0) {
          auVar28 = vpackusdw_avx2(auVar28,auVar28);
          uStack_e10 = auVar28._16_8_;
          *(undefined8 *)(lVar5 + (long)(local_978 * iVar3 + local_97c) * 2) = uStack_e10;
          *(undefined8 *)(lVar5 + (long)(local_978 * iVar3 + local_97c + iVar3) * 2) = local_e40;
        }
        else {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)(lVar5 + (long)(local_978 * iVar3 + local_97c) * 2);
          auVar12._16_16_ = auVar7;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(lVar5 + (long)(local_978 * iVar3 + local_97c + iVar3) * 2);
          auVar11._16_16_ = auVar7;
          auVar28 = vperm2i128_avx2(auVar12,auVar11,0x20);
          auVar28 = vpunpcklwd_avx2(auVar28,ZEXT832(uStack_8d8) << 0x40);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_fffffffffffff018,
                          use_dist_wtd_comp_avg_00);
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar26,uVar33),(__m256i *)CONCAT44(uVar24,uVar32),
                     (__m256i *)CONCAT44(subpel_q4,uVar31),
                     CONCAT22(uVar21,in_stack_ffffffffffffef9c));
          auVar28 = vpackusdw_avx2(auVar28,auVar28);
          auVar15._16_8_ = uStack_bd0;
          auVar15._0_16_ = auVar27;
          auVar15._24_8_ = uStack_bc8;
          auVar28 = vpminsw_avx2(auVar28,auVar15);
          uStack_dd0 = auVar28._16_8_;
          *(undefined8 *)(in_RDX + (long)(local_978 * in_ECX + local_97c) * 2) = uStack_dd0;
          *(undefined8 *)(in_RDX + (long)(local_978 * in_ECX + local_97c + in_ECX) * 2) = local_e00;
        }
      }
      else {
        auVar29 = vpunpckhdq_avx2(auVar29,auVar8);
        auVar13._16_8_ = uStack_f0;
        auVar13._0_16_ = auVar7;
        auVar13._24_8_ = uStack_e8;
        auVar29 = vpaddd_avx2(auVar29,auVar13);
        if (iVar4 == 0) {
          auVar28 = vpackusdw_avx2(auVar28,auVar29);
          local_1020 = auVar28._0_8_;
          uStack_1018 = auVar28._8_8_;
          uStack_1010 = auVar28._16_8_;
          uStack_1008 = auVar28._24_8_;
          puVar23 = (undefined8 *)(lVar5 + (long)(local_978 * iVar3 + local_97c) * 2);
          *puVar23 = local_1020;
          puVar23[1] = uStack_1018;
          puVar23 = (undefined8 *)(lVar5 + (long)(local_978 * iVar3 + local_97c + iVar3) * 2);
          *puVar23 = uStack_1010;
          puVar23[1] = uStack_1008;
        }
        else {
          auVar10._16_16_ = auVar7;
          auVar10._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)(local_978 * iVar3 + local_97c) * 2)
          ;
          auVar28._16_16_ = auVar7;
          auVar28._0_16_ =
               *(undefined1 (*) [16])(lVar5 + (long)(local_978 * iVar3 + local_97c + iVar3) * 2);
          auVar28 = vperm2i128_avx2(auVar10,auVar28,0x20);
          vpunpcklwd_avx2(auVar28,ZEXT832(uStack_8d8) << 0x40);
          auVar28 = vpunpckhwd_avx2(auVar28,ZEXT832(uStack_8d8) << 0x40);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_fffffffffffff018,
                          use_dist_wtd_comp_avg_00);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_fffffffffffff018,
                          (int)((ulong)in_stack_fffffffffffff010 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar26,uVar33),(__m256i *)CONCAT44(uVar24,uVar32),
                     (__m256i *)CONCAT44(subpel_q4,uVar31),
                     CONCAT22(uVar21,in_stack_ffffffffffffef9c));
          auVar29 = auVar28;
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar26,uVar33),(__m256i *)CONCAT44(uVar24,uVar32),
                     (__m256i *)CONCAT44(subpel_q4,uVar31),
                     CONCAT22(uVar21,in_stack_ffffffffffffef9c));
          auVar28 = vpackusdw_avx2(auVar28,auVar29);
          auVar14._16_8_ = uStack_bd0;
          auVar14._0_16_ = auVar27;
          auVar14._24_8_ = uStack_bc8;
          local_fe0 = vpminsw_avx2(auVar28,auVar14);
          puVar23 = (undefined8 *)(in_RDX + (long)(local_978 * in_ECX + local_97c) * 2);
          *puVar23 = wt0_00;
          puVar23[1] = res_unsigned;
          puVar23 = (undefined8 *)(in_RDX + (long)(local_978 * in_ECX + local_97c + in_ECX) * 2);
          *puVar23 = data_ref_0_00;
          puVar23[1] = palStack_fc8;
          in_stack_fffffffffffff008 = palStack_fc8;
          in_stack_fffffffffffff010 = wt0_00;
          in_stack_fffffffffffff018 = res_unsigned;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m256i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm256_sll_epi32(res_odd, round_shift_bits);

      __m256i res1 = _mm256_unpacklo_epi32(res_even, res_odd);

      __m256i res_unsigned_lo = _mm256_add_epi32(res1, offset_const);

      if (w - j < 8) {
        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

          const __m256i comp_avg_res = highbd_comp_avg(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m256i round_result = highbd_convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result, round_result);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      } else {
        __m256i res2 = _mm256_unpackhi_epi32(res_even, res_odd);
        __m256i res_unsigned_hi = _mm256_add_epi32(res2, offset_const);

        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);
          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                          res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}